

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

void __thiscall google::FlagSaverImpl::RestoreToRegistry(FlagSaverImpl *this)

{
  Mutex *pMVar1;
  int iVar2;
  FlagRegistry *pFVar3;
  CommandLineFlag *src;
  CommandLineFlag *this_00;
  pointer ppCVar4;
  pointer ppCVar5;
  
  pFVar3 = this->main_registry_;
  iVar2 = (pFVar3->lock_).mutex_;
  (pFVar3->lock_).mutex_ = iVar2 + -1;
  if (iVar2 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                  ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
  }
  ppCVar4 = (this->backup_registry_).
            super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar5 = (this->backup_registry_).
            super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar4 == ppCVar5) {
    (pFVar3->lock_).mutex_ = 0;
  }
  else {
    do {
      src = *ppCVar4;
      this_00 = anon_unknown_1::FlagRegistry::FindFlagLocked(this->main_registry_,src->name_);
      if (this_00 != (CommandLineFlag *)0x0) {
        anon_unknown_1::CommandLineFlag::CopyFrom(this_00,src);
        ppCVar5 = (this->backup_registry_).
                  super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppCVar4 = ppCVar4 + 1;
    } while (ppCVar4 != ppCVar5);
    pMVar1 = &pFVar3->lock_;
    pMVar1->mutex_ = pMVar1->mutex_ + 1;
    if (pMVar1->mutex_ != 0) {
      __assert_fail("mutex_++ == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                    ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
    }
  }
  return;
}

Assistant:

void RestoreToRegistry() {
    FlagRegistryLock frl(main_registry_);
    vector<CommandLineFlag*>::const_iterator it;
    for (it = backup_registry_.begin(); it != backup_registry_.end(); ++it) {
      CommandLineFlag* main = main_registry_->FindFlagLocked((*it)->name());
      if (main != NULL) {       // if NULL, flag got deleted from registry(!)
        main->CopyFrom(**it);
      }
    }
  }